

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

DomCustomWidget * __thiscall
QMap<QString,_DomCustomWidget_*>::value
          (QMap<QString,_DomCustomWidget_*> *this,QString *key,DomCustomWidget **defaultValue)

{
  QMapData<std::map<QString,_DomCustomWidget_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<QString,_DomCustomWidget_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<QString,_std::pair<const_QString,_DomCustomWidget_*>,_std::_Select1st<std::pair<const_QString,_DomCustomWidget_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      defaultValue = (DomCustomWidget **)&cVar2._M_node[1]._M_right;
    }
  }
  return *defaultValue;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }